

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintExpressionContents::visitStringEncode(PrintExpressionContents *this,StringEncode *curr)

{
  StringEncode *curr_local;
  PrintExpressionContents *this_local;
  
  switch(curr->op) {
  case StringEncodeUTF8:
    printMedium(this->o,"string.encode_wtf8 utf8");
    break;
  case StringEncodeWTF8:
    printMedium(this->o,"string.encode_wtf8 wtf8");
    break;
  case StringEncodeWTF16:
    printMedium(this->o,"string.encode_wtf16");
    break;
  case StringEncodeUTF8Array:
    printMedium(this->o,"string.encode_wtf8_array utf8");
    break;
  case StringEncodeWTF8Array:
    printMedium(this->o,"string.encode_wtf8_array wtf8");
    break;
  case StringEncodeWTF16Array:
    printMedium(this->o,"string.encode_wtf16_array");
    break;
  default:
    handle_unreachable("invalid string.encode*",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/Print.cpp"
                       ,0x99a);
  }
  return;
}

Assistant:

void visitStringEncode(StringEncode* curr) {
    switch (curr->op) {
      case StringEncodeUTF8:
        printMedium(o, "string.encode_wtf8 utf8");
        break;
      case StringEncodeWTF8:
        printMedium(o, "string.encode_wtf8 wtf8");
        break;
      case StringEncodeWTF16:
        printMedium(o, "string.encode_wtf16");
        break;
      case StringEncodeUTF8Array:
        printMedium(o, "string.encode_wtf8_array utf8");
        break;
      case StringEncodeWTF8Array:
        printMedium(o, "string.encode_wtf8_array wtf8");
        break;
      case StringEncodeWTF16Array:
        printMedium(o, "string.encode_wtf16_array");
        break;
      default:
        WASM_UNREACHABLE("invalid string.encode*");
    }
  }